

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_context_reg_read_batch2(uc_context *ctx,int *regs,void **vals,size_t *sizes,int count)

{
  uc_mode mode;
  uc_err uVar1;
  ulong uVar2;
  ulong uVar3;
  context_reg_rw_t cVar4;
  
  mode = ctx->mode;
  cVar4 = find_context_reg_rw(ctx->arch,mode);
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = 0;
  }
  uVar3 = 0;
  do {
    if (uVar2 == uVar3) {
      return UC_ERR_OK;
    }
    uVar1 = (*cVar4.read)(&ctx->field_0x14,mode,regs[uVar3],vals[uVar3],sizes);
    uVar3 = uVar3 + 1;
    sizes = sizes + 1;
  } while (uVar1 == UC_ERR_OK);
  return uVar1;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_reg_read_batch2(uc_context *ctx, int *regs, void *const *vals,
                                  size_t *sizes, int count)
{
    reg_read_t reg_read = find_context_reg_rw(ctx->arch, ctx->mode).read;
    void *env = ctx->data;
    int mode = ctx->mode;
    int i;

    for (i = 0; i < count; i++) {
        unsigned int regid = regs[i];
        void *value = vals[i];
        uc_err err = reg_read(env, mode, regid, value, sizes + i);
        if (err) {
            return err;
        }
    }

    return UC_ERR_OK;
}